

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

int trytop(rnndb *db,char *file,xmlNode *node)

{
  int iVar1;
  char *local_38;
  char *subfile;
  xmlAttr *attr;
  xmlNode *node_local;
  char *file_local;
  rnndb *db_local;
  
  iVar1 = strcmp((char *)node->name,"enum");
  if (iVar1 == 0) {
    parseenum(db,file,node);
    db_local._4_4_ = 1;
  }
  else {
    iVar1 = strcmp((char *)node->name,"bitset");
    if (iVar1 == 0) {
      parsebitset(db,file,node);
      db_local._4_4_ = 1;
    }
    else {
      iVar1 = strcmp((char *)node->name,"group");
      if (iVar1 == 0) {
        parsegroup(db,file,node);
        db_local._4_4_ = 1;
      }
      else {
        iVar1 = strcmp((char *)node->name,"domain");
        if (iVar1 == 0) {
          parsedomain(db,file,node);
          db_local._4_4_ = 1;
        }
        else {
          iVar1 = strcmp((char *)node->name,"spectype");
          if (iVar1 == 0) {
            parsespectype(db,file,node);
            db_local._4_4_ = 1;
          }
          else {
            iVar1 = strcmp((char *)node->name,"import");
            if (iVar1 == 0) {
              subfile = (char *)node->properties;
              local_38 = (char *)0x0;
              for (; subfile != (char *)0x0; subfile = *(char **)(subfile + 0x30)) {
                iVar1 = strcmp(*(char **)(subfile + 0x10),"file");
                if (iVar1 == 0) {
                  local_38 = getattrib(db,file,(uint)node->line,(xmlAttr *)subfile);
                }
                else {
                  fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for import\n",file,
                          (ulong)node->line,*(undefined8 *)(subfile + 0x10));
                  db->estatus = 1;
                }
              }
              if (local_38 == (char *)0x0) {
                fprintf(_stderr,"%s:%d: missing \"file\" attribute for import\n",file,
                        (ulong)node->line);
                db->estatus = 1;
              }
              else {
                rnn_parsefile(db,local_38);
              }
              db_local._4_4_ = 1;
            }
            else {
              iVar1 = strcmp((char *)node->name,"copyright");
              if (iVar1 == 0) {
                parsecopyright(db,file,node);
                db_local._4_4_ = 1;
              }
              else {
                db_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  return db_local._4_4_;
}

Assistant:

static int trytop (struct rnndb *db, char *file, xmlNode *node) {
	if (!strcmp(node->name, "enum")) {
		parseenum(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "bitset")) {
		parsebitset(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "group")) {
		parsegroup(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "domain")) {
		parsedomain(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "spectype")) {
		parsespectype(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "import")) {
		xmlAttr *attr = node->properties;
		char *subfile = 0;
		while (attr) {
			if (!strcmp(attr->name, "file")) {
				subfile = getattrib(db, file, node->line, attr);
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for import\n", file, node->line, attr->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		if (!subfile) {
			fprintf (stderr, "%s:%d: missing \"file\" attribute for import\n", file, node->line);
			db->estatus = 1;
		} else {
			rnn_parsefile(db, subfile);
		}
		return 1;
	} else if (!strcmp(node->name, "copyright")) {
		parsecopyright(db, file, node);
		return 1;
	}
	return 0;
}